

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

ProcessorProperty * __thiscall
soul::PoolAllocator::
allocate<soul::AST::ProcessorProperty,soul::AST::Context&,soul::heart::ProcessorProperty::Property&>
          (PoolAllocator *this,Context *args,Property *args_1)

{
  DestructorFn *pDVar1;
  void **this_00;
  _lambda_void___1_ local_31;
  void **local_30;
  ProcessorProperty *newObject;
  PoolItem *newItem;
  Property *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_1;
  args_local_1 = (Property *)args;
  args_local = (Context *)this;
  newObject = (ProcessorProperty *)allocateSpaceForObject(this,0x30);
  this_00 = &((PoolItem *)newObject)->item;
  AST::ProcessorProperty::ProcessorProperty
            ((ProcessorProperty *)this_00,(Context *)args_local_1,(Property)newItem->size);
  local_30 = this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::heart::ProcessorProperty::Property&)::
           {lambda(void*)#1}::operator_cast_to_function_pointer(&local_31);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return (ProcessorProperty *)local_30;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }